

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::next_after_siblings(depth_first_traverser *this)

{
  bool bVar1;
  __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
  this_00;
  reference pvVar2;
  depth_first_traverser *in_RDI;
  __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
  *in_stack_ffffffffffffffe8;
  depth_first_traverser *local_8;
  
  bVar1 = std::
          vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ::empty(&in_RDI->stack_);
  local_8 = in_RDI;
  if (!bVar1) {
    std::
    vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ::back(&in_RDI->stack_);
    this_00 = __gnu_cxx::
              __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
              ::operator-(in_stack_ffffffffffffffe8,(difference_type)in_RDI);
    pvVar2 = std::
             vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ::back(&in_RDI->stack_);
    (pvVar2->cur)._M_current = this_00._M_current;
    next_sibling((depth_first_traverser *)this_00._M_current);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

depth_first_traverser&
        next_after_siblings() {
            if(stack_.empty()) return *this;
            stack_.back().cur = stack_.back().end-1;
            next_sibling();
            return *this;
        }